

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::ConfigRuleClauseSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  local_1 = kind == ConfigLiblist || kind == ConfigUseClause;
  return local_1;
}

Assistant:

bool ConfigRuleClauseSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::ConfigLiblist:
        case SyntaxKind::ConfigUseClause:
            return true;
        default:
            return false;
    }
}